

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::_free_list_rem(Tree *this,size_t i)

{
  NodeData *pNVar1;
  long in_RSI;
  long in_RDI;
  size_t in_stack_00000038;
  Tree *in_stack_00000040;
  size_t in_stack_00000098;
  Tree *in_stack_000000a0;
  
  if (*(long *)(in_RDI + 0x18) == in_RSI) {
    pNVar1 = _p(in_stack_00000040,in_stack_00000038);
    *(size_t *)(in_RDI + 0x18) = pNVar1->m_next_sibling;
  }
  _rem_hierarchy(in_stack_000000a0,in_stack_00000098);
  return;
}

Assistant:

void Tree::_free_list_rem(size_t i)
{
    if(m_free_head == i)
        m_free_head = _p(i)->m_next_sibling;
    _rem_hierarchy(i);
}